

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

cf_char_t * cf_strcpy_s(cf_char_t *dst,cf_size_t dstsize,cf_char_t *src)

{
  char *pcVar1;
  cf_void_t *pcVar2;
  ulong src_size;
  
  if (src != (cf_char_t *)0x0 && dst != (cf_char_t *)0x0) {
    src_size = 0;
    do {
      pcVar1 = src + src_size;
      src_size = src_size + 1;
    } while (*pcVar1 != '\0');
    if (src_size <= dstsize) {
      pcVar2 = cf_memcpy_s(dst,dstsize,src,src_size);
      if (pcVar2 != (cf_void_t *)0x0) {
        return dst;
      }
      return (cf_char_t *)0x0;
    }
  }
  return (cf_char_t *)0x0;
}

Assistant:

cf_char_t* cf_strcpy_s(cf_char_t* dst, cf_size_t dstsize, const cf_char_t* src) {
    cf_size_t srcsize;
    if(!dst || !src) return CF_NULL_PTR;

    srcsize = cf_strlen(src) + 1;
    if(srcsize > dstsize) return CF_NULL_PTR;
    if(!cf_memcpy_s(dst, dstsize, src, srcsize)) return CF_NULL_PTR;
    return dst;
}